

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

void __thiscall spoa::Graph::AddEdge(Graph *this,Node *tail,Node *head,uint32_t weight)

{
  pointer ppEVar1;
  Node *pNVar2;
  pointer ppNVar3;
  pointer ppNVar4;
  pointer ppEVar5;
  Edge *pEVar6;
  pointer puVar7;
  uint __tmp;
  bool bVar8;
  _Head_base<0UL,_spoa::Graph::Edge_*,_false> local_38;
  
  ppEVar5 = (tail->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar1 = (tail->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  bVar8 = ppEVar5 == ppEVar1;
  if (!bVar8) {
    pEVar6 = *ppEVar5;
    pNVar2 = pEVar6->head;
    while (pNVar2 != head) {
      ppEVar5 = ppEVar5 + 1;
      bVar8 = ppEVar5 == ppEVar1;
      if (bVar8) goto LAB_00112c65;
      pEVar6 = *ppEVar5;
      pNVar2 = pEVar6->head;
    }
    Edge::AddSequence(pEVar6,(uint32_t)
                             ((ulong)((long)(this->sequences_).
                                            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->sequences_).
                                           super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3),weight);
    if (!bVar8) {
      return;
    }
  }
LAB_00112c65:
  pEVar6 = (Edge *)operator_new(0x30);
  ppNVar3 = (this->sequences_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar4 = (this->sequences_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pEVar6->tail = tail;
  pEVar6->head = head;
  *(undefined8 *)
   &(pEVar6->labels).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl = 0;
  *(pointer *)
   ((long)&(pEVar6->labels).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 8) =
       (pointer)0x0;
  *(pointer *)
   ((long)&(pEVar6->labels).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 0x10)
       = (pointer)0x0;
  puVar7 = (pointer)operator_new(4);
  *(pointer *)
   &(pEVar6->labels).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl =
       puVar7;
  *(pointer *)
   ((long)&(pEVar6->labels).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 8) =
       puVar7;
  *(pointer *)
   ((long)&(pEVar6->labels).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 0x10)
       = puVar7 + 1;
  *puVar7 = (uint)((ulong)((long)ppNVar4 - (long)ppNVar3) >> 3);
  *(pointer *)
   ((long)&(pEVar6->labels).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 8) =
       puVar7 + 1;
  pEVar6->weight = (ulong)weight;
  local_38._M_head_impl = pEVar6;
  std::
  vector<std::unique_ptr<spoa::Graph::Edge,std::default_delete<spoa::Graph::Edge>>,std::allocator<std::unique_ptr<spoa::Graph::Edge,std::default_delete<spoa::Graph::Edge>>>>
  ::emplace_back<spoa::Graph::Edge*>
            ((vector<std::unique_ptr<spoa::Graph::Edge,std::default_delete<spoa::Graph::Edge>>,std::allocator<std::unique_ptr<spoa::Graph::Edge,std::default_delete<spoa::Graph::Edge>>>>
              *)&this->edges_,&local_38._M_head_impl);
  local_38._M_head_impl =
       (this->edges_).
       super__Vector_base<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>,_std::allocator<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>._M_t.
       super__Tuple_impl<0UL,_spoa::Graph::Edge_*,_std::default_delete<spoa::Graph::Edge>_>.
       super__Head_base<0UL,_spoa::Graph::Edge_*,_false>._M_head_impl;
  std::vector<spoa::Graph::Edge*,std::allocator<spoa::Graph::Edge*>>::
  emplace_back<spoa::Graph::Edge*>
            ((vector<spoa::Graph::Edge*,std::allocator<spoa::Graph::Edge*>> *)&tail->outedges,
             &local_38._M_head_impl);
  local_38._M_head_impl =
       (this->edges_).
       super__Vector_base<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>,_std::allocator<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>._M_t.
       super__Tuple_impl<0UL,_spoa::Graph::Edge_*,_std::default_delete<spoa::Graph::Edge>_>.
       super__Head_base<0UL,_spoa::Graph::Edge_*,_false>._M_head_impl;
  std::vector<spoa::Graph::Edge*,std::allocator<spoa::Graph::Edge*>>::
  emplace_back<spoa::Graph::Edge*>
            ((vector<spoa::Graph::Edge*,std::allocator<spoa::Graph::Edge*>> *)&head->inedges,
             &local_38._M_head_impl);
  return;
}

Assistant:

void Graph::AddEdge(Node* tail, Node* head, std::uint32_t weight) {
  for (const auto& it : tail->outedges) {
    if (it->head == head) {
      it->AddSequence(sequences_.size(), weight);
      return;
    }
  }
  edges_.emplace_back(new Edge(tail, head, sequences_.size(), weight));
  tail->outedges.emplace_back(edges_.back().get());
  head->inedges.emplace_back(edges_.back().get());
}